

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adapt_slots.cpp
# Opt level: O2

int main(void)

{
  slot_type *s;
  slot_type *s_00;
  slot_type *s_01;
  slot_type *s_02;
  __sighandler_t in_RDX;
  __sighandler_t __handler;
  __sighandler_t __handler_00;
  __sighandler_t __handler_01;
  __sighandler_t __handler_02;
  int in_ESI;
  int __sig;
  int *value;
  connection cVar1;
  int local_1f0;
  int i;
  signal<int_(int)> d;
  signal<int_()> c;
  signal<void_(int)> b;
  signal<void_()> a;
  
  i = 0;
  obs::signal<void_()>::signal(&a,in_ESI,in_RDX);
  s = (slot_type *)operator_new(0x28);
  (s->super_slot_base)._vptr_slot_base = (_func_int **)&PTR__slot_00109bd8;
  *(undefined8 *)((long)&(s->f).super__Function_base._M_functor + 8) = 0;
  *(int **)&(s->f).super__Function_base._M_functor = &i;
  (s->f)._M_invoker =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/tests/adapt_slots.cpp:17:39)>
       ::_M_invoke;
  (s->f).super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/tests/adapt_slots.cpp:17:39)>
       ::_M_manager;
  cVar1 = obs::signal<void_()>::add_slot(&a,s);
  obs::signal<void_(int)>::signal(&b,(int)s,(__sighandler_t)cVar1.m_slot);
  s_00 = (slot_type *)operator_new(0x28);
  (s_00->super_slot_base)._vptr_slot_base = (_func_int **)&PTR__slot_00109ca0;
  *(undefined8 *)((long)&(s_00->f).super__Function_base._M_functor + 8) = 0;
  *(int **)&(s_00->f).super__Function_base._M_functor = &i;
  (s_00->f)._M_invoker =
       std::
       _Function_handler<void_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/./obs/slot.h:70:17)>
       ::_M_invoke;
  (s_00->f).super__Function_base._M_manager =
       std::
       _Function_handler<void_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/./obs/slot.h:70:17)>
       ::_M_manager;
  cVar1 = obs::signal<void_(int)>::add_slot(&b,s_00);
  obs::signal<int_()>::signal(&c,(int)s_00,(__sighandler_t)cVar1.m_slot);
  s_01 = (slot_type *)operator_new(0x28);
  (s_01->super_slot_base)._vptr_slot_base = (_func_int **)&PTR__slot_00109d18;
  *(undefined8 *)((long)&(s_01->f).super__Function_base._M_functor + 8) = 0;
  *(int **)&(s_01->f).super__Function_base._M_functor = &i;
  (s_01->f)._M_invoker =
       std::
       _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/tests/adapt_slots.cpp:19:39)>
       ::_M_invoke;
  (s_01->f).super__Function_base._M_manager =
       std::
       _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/tests/adapt_slots.cpp:19:39)>
       ::_M_manager;
  cVar1 = obs::signal<int_()>::add_slot(&c,s_01);
  obs::signal<int_(int)>::signal(&d,(int)s_01,(__sighandler_t)cVar1.m_slot);
  s_02 = (slot_type *)operator_new(0x28);
  (s_02->super_slot_base)._vptr_slot_base = (_func_int **)&PTR__slot_00109d90;
  *(undefined8 *)((long)&(s_02->f).super__Function_base._M_functor + 8) = 0;
  *(int **)&(s_02->f).super__Function_base._M_functor = &i;
  (s_02->f)._M_invoker =
       std::
       _Function_handler<int_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/./obs/slot.h:44:17)>
       ::_M_invoke;
  (s_02->f).super__Function_base._M_manager =
       std::
       _Function_handler<int_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/./obs/slot.h:44:17)>
       ::_M_manager;
  obs::signal<int_(int)>::add_slot(&d,s_02);
  obs::signal<void_()>::operator()<>(&a);
  local_1f0 = 1;
  obs::signal<void(int)>::operator()((signal<void(int)> *)&b,&local_1f0);
  obs::signal<int_()>::operator()<>(&c);
  local_1f0 = 1;
  obs::signal<int(int)>::operator()((signal<int(int)> *)&d,&local_1f0);
  local_1f0 = 4;
  value = &i;
  expect_eq<int,int>(&local_1f0,value,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/tests/adapt_slots.cpp"
                     ,0x1a);
  __sig = (int)value;
  obs::signal<int_(int)>::~signal(&d,__sig,__handler);
  obs::signal<int_()>::~signal(&c,__sig,__handler_00);
  obs::signal<void_(int)>::~signal(&b,__sig,__handler_01);
  obs::signal<void_()>::~signal(&a,__sig,__handler_02);
  return 0;
}

Assistant:

int main() {
  static_assert(true == obs::is_callable_without_args<void()>::value, "");
  static_assert(true == obs::is_callable_without_args<int()>::value, "");
  static_assert(false == obs::is_callable_without_args<void(int)>::value, "");
  static_assert(false == obs::is_callable_without_args<int(int)>::value, "");

  int i = 0;
  obs::signal<void()   > a; a.connect([&i]{ ++i; });
  obs::signal<void(int)> b; b.connect([&i]{ ++i; });
  obs::signal<int ()   > c; c.connect([&i]{ return ++i; });
  obs::signal<int (int)> d; d.connect([&i]{ return ++i; });

  a();
  b(1);
  c();
  d(1);
  EXPECT_EQ(4, i);
}